

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O1

int64_t HighsIntegers::denominator(double x,double eps,int64_t maxdenom)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  HighsCDouble local_78;
  HighsCDouble local_68;
  double local_50;
  double local_48;
  
  dVar1 = (double)(long)x;
  local_78.hi = x - dVar1;
  local_78.lo = (-dVar1 - (local_78.hi - x)) + (x - (local_78.hi - (local_78.hi - x))) + 0.0;
  lVar5 = 1;
  lVar6 = (long)x;
  lVar2 = 1;
  lVar3 = 0;
  local_50 = eps;
  local_48 = x;
  while (lVar7 = lVar2, local_50 < local_78.hi + local_78.lo) {
    local_68.hi = 1.0;
    local_68.lo = 0.0;
    HighsCDouble::operator/=(&local_68,&local_78);
    if (9007199254740992.0 < local_68.hi + local_68.lo) break;
    lVar4 = (long)(local_68.hi + local_68.lo);
    lVar2 = lVar7 * lVar4 + lVar3;
    if (maxdenom < lVar2) break;
    lVar3 = lVar6 * lVar4 + lVar5;
    local_78.hi = local_68.hi - (double)lVar4;
    lVar5 = lVar6;
    lVar6 = lVar3;
    lVar3 = lVar7;
    local_78.lo = local_68.lo +
                  (-(double)lVar4 - (local_78.hi - local_68.hi)) +
                  (local_68.hi - (local_78.hi - (local_78.hi - local_68.hi)));
  }
  lVar2 = (maxdenom - lVar3) / lVar7;
  lVar3 = lVar2 * lVar7 + lVar3;
  if (ABS(ABS(local_48) - (double)lVar6 / (double)lVar7) <
      ABS(ABS(local_48) - (double)(lVar2 * lVar6 + lVar5) / (double)lVar3)) {
    lVar3 = lVar7;
  }
  return lVar3;
}

Assistant:

static int64_t denominator(double x, double eps, int64_t maxdenom) {
    int64_t ai = (int64_t)x;
    int64_t m[] = {ai, 1, 1, 0};

    HighsCDouble xi = x;
    HighsCDouble fraction = xi - double(ai);

    while (fraction > eps) {
      xi = 1.0 / fraction;
      if (double(xi) > double(int64_t{1} << 53)) break;

      ai = (int64_t)(double)xi;
      int64_t t = m[2] * ai + m[3];
      if (t > maxdenom) break;

      m[3] = m[2];
      m[2] = t;

      t = m[0] * ai + m[1];
      m[1] = m[0];
      m[0] = t;

      fraction = xi - ai;
    }

    ai = (maxdenom - m[3]) / m[2];
    m[1] += m[0] * ai;
    m[3] += m[2] * ai;

    double x0 = static_cast<double>(m[0]) / static_cast<double>(m[2]);
    double x1 = static_cast<double>(m[1]) / static_cast<double>(m[3]);
    x = std::abs(x);
    double err0 = std::abs(x - x0);
    double err1 = std::abs(x - x1);

    if (err0 < err1) return m[2];
    return m[3];
  }